

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O3

NodesSeq<dg::dda::RWNode> * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createNode
          (NodesSeq<dg::dda::RWNode> *__return_storage_ptr__,LLVMReadWriteGraphBuilder *this,
          Value *v)

{
  uint uVar1;
  Value VVar2;
  LLVMDataDependenceAnalysisOptions *pLVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  RWNodeType t;
  undefined1 auVar9 [16];
  key_type local_58;
  _Base_ptr local_38;
  
  VVar2 = v[0x10];
  if (VVar2 == (Value)0x3) {
    t = GLOBAL;
LAB_001111dc:
    local_58._M_dataplus._M_p = (pointer)ReadWriteGraph::create(&this->graph,t);
  }
  else {
    if ((byte)VVar2 < 0x1b) {
switchD_00111246_caseD_3d:
      (__return_storage_ptr__->nodes).
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->representant = (RWNode *)0x0;
      (__return_storage_ptr__->nodes).
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->nodes).
      super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      return __return_storage_ptr__;
    }
    switch(VVar2) {
    case (Value)0x3a:
      local_58._M_dataplus._M_p = (pointer)createAlloc(this,(Instruction *)v);
      break;
    case (Value)0x3b:
      if (this->buildUses != true) goto switchD_00111246_caseD_3d;
      local_58._M_dataplus._M_p = (pointer)createLoad(this,(Instruction *)v);
      break;
    case (Value)0x3c:
      local_58._M_dataplus._M_p = (pointer)createStore(this,(Instruction *)v);
      break;
    case (Value)0x3d:
    case (Value)0x3e:
    case (Value)0x3f:
      goto switchD_00111246_caseD_3d;
    case (Value)0x40:
      local_58._M_dataplus._M_p = (pointer)createAtomicRMW(this,(Instruction *)v);
      break;
    default:
      if (VVar2 != (Value)0x1c) {
        if (VVar2 == (Value)0x53) {
          pLVar3 = this->_options;
          bVar4 = llvm::DbgValueInst::classof(v);
          if (!bVar4) {
            lVar5 = llvm::Value::stripPointerCasts();
            if (((lVar5 != 0) && (*(char *)(lVar5 + 0x10) == '\0')) &&
               (*(long *)(lVar5 + 0x48) == lVar5 + 0x48)) {
              auVar9 = llvm::Value::getName();
              lVar6 = auVar9._0_8_;
              if (lVar6 == 0) {
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                local_58._M_string_length = 0;
                local_58.field_2._M_local_buf[0] = '\0';
              }
              else {
                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_58,lVar6,auVar9._8_8_ + lVar6);
              }
              cVar7 = std::
                      _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
                      ::find((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::FunctionModel>_>_>
                              *)(pLVar3 + 0x68),&local_58);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                local_38 = cVar7._M_node;
                operator_delete(local_58._M_dataplus._M_p,
                                CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                         local_58.field_2._M_local_buf[0]) + 1);
                cVar7._M_node = local_38;
              }
              if (cVar7._M_node == (_Base_ptr)(pLVar3 + 0x70)) {
                auVar9 = llvm::Value::getName();
                lVar6 = auVar9._0_8_;
                if (lVar6 == 0) {
                  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                  local_58._M_string_length = 0;
                  local_58.field_2._M_local_buf[0] = '\0';
                }
                else {
                  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_58,lVar6,auVar9._8_8_ + lVar6);
                }
                cVar8 = std::
                        _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                        ::find((_Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dg::AllocationFunction>_>_>
                                *)(pLVar3 + 0x28),&local_58);
                if (cVar8._M_node == (_Base_ptr)(pLVar3 + 0x30)) {
                  bVar4 = false;
                }
                else {
                  bVar4 = cVar8._M_node[2]._M_color != _S_red;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  operator_delete(local_58._M_dataplus._M_p,
                                  CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                           local_58.field_2._M_local_buf[0]) + 1);
                }
                if ((!bVar4) && ((*(byte *)(lVar5 + 0x21) & 0x20) != 0)) {
                  uVar1 = *(int *)(lVar5 + 0x24) - 0xbf;
                  if (((5 < uVar1) || ((0x29U >> (uVar1 & 0x1f) & 1) == 0)) &&
                     (*(int *)(lVar5 + 0x24) != 0x134)) goto switchD_00111246_caseD_3d;
                }
              }
            }
            createCall(__return_storage_ptr__,this,(Instruction *)v);
            return __return_storage_ptr__;
          }
        }
        goto switchD_00111246_caseD_3d;
      }
      t = RETURN;
      goto LAB_001111dc;
    }
  }
  (__return_storage_ptr__->nodes).
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->nodes).
  super__Vector_base<dg::dda::RWNode_*,_std::allocator<dg::dda::RWNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->representant = (RWNode *)0x0;
  std::vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>>::
  _M_range_insert<dg::dda::RWNode*const*>
            ((vector<dg::dda::RWNode*,std::allocator<dg::dda::RWNode*>> *)__return_storage_ptr__,0,
             &local_58);
  __return_storage_ptr__->representant = (RWNode *)local_58._M_dataplus._M_p;
  return __return_storage_ptr__;
}

Assistant:

NodesSeq<RWNode> LLVMReadWriteGraphBuilder::createNode(const llvm::Value *v) {
    using namespace llvm;
    if (isa<GlobalVariable>(v)) {
        // global variables are like allocations
        return {&create(RWNodeType::GLOBAL)};
    }

    const auto *I = dyn_cast<Instruction>(v);
    if (!I)
        return {};

    // we may created this node when searching for an operand
    switch (I->getOpcode()) {
    case Instruction::Alloca:
        // we need alloca's as target to DefSites
        return {createAlloc(I)};
    case Instruction::Store:
        return {createStore(I)};
    case Instruction::AtomicRMW:
        return {createAtomicRMW(I)};
    case Instruction::Load:
        if (buildUses) {
            return {createLoad(I)};
        }
        break;
    case Instruction::Ret:
        // we need create returns, since
        // these modify CFG and thus data-flow
        return {createReturn(I)};
    case Instruction::Call:
        if (!isRelevantCall(I, _options))
            break;

        return createCall(I);
    }

    return {};
}